

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86_avx512::forward(Crop_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *__ptr;
  Allocator *pAVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  int *piVar33;
  pointer pMVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  sbyte sVar38;
  int iVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  int *piVar43;
  undefined7 uVar44;
  uint uVar45;
  long lVar46;
  bool bVar47;
  int _outw;
  int _outh;
  int _woffset;
  uint local_15c;
  Mat m;
  int _outc;
  int _outd;
  int _hoffset;
  uint local_fc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_e0;
  Allocator *pAStack_d8;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  int local_c0;
  size_t local_b8;
  int _coffset;
  size_t local_90;
  int local_88;
  int _doffset;
  Mat m_2;
  
  local_15c = bottom_blob->w;
  local_fc = bottom_blob->h;
  local_88 = bottom_blob->d;
  iVar35 = bottom_blob->c;
  iVar39 = bottom_blob->dims;
  local_90 = bottom_blob->elemsize;
  iVar1 = bottom_blob->elempack;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (iVar39 - 1U < 4) {
      lVar36 = (long)(int)local_15c;
      m.w = local_15c;
      switch(iVar39) {
      case 1:
        m.w = iVar1 * local_15c;
        m.dims = 1;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        m.cstep = (size_t)m.w;
        goto LAB_002746ff;
      case 2:
        m.h = iVar1 * local_fc;
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar36;
        goto LAB_00274784;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar36 = (int)local_fc * lVar36;
        break;
      case 4:
        m.dims = 4;
        lVar36 = (int)local_fc * lVar36 * (long)local_88;
        m.d = local_88;
      }
      m.c = iVar1 * iVar35;
      m.cstep = lVar36 + 3U & 0x3ffffffffffffffc;
      m.h = local_fc;
LAB_002746ff:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_00274784:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    piVar43 = &_doffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,piVar43,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar33 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar33 != (int *)0x0) {
      LOCK();
      *piVar33 = *piVar33 + -1;
      UNLOCK();
      if (*piVar33 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_00274aa6;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar34 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = bottom_blob->w;
    lVar36 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar36;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar36 * m.w;
    break;
  case 3:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    m.d = 1;
    lVar36 = (long)m.h * (long)m.w;
    goto LAB_002748ba;
  case 4:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.d = bottom_blob->d;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 4;
    lVar36 = (long)m.h * (long)m.w * (long)m.d;
LAB_002748ba:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar36 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar43 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->refcount;
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar34->cstep = 0;
    pMVar34->data = (void *)0x0;
    pMVar34->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar34->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar34->elemsize + 4) = 0;
    pMVar34->dims = 0;
    pMVar34->w = 0;
    pMVar34->h = 0;
    pMVar34->d = 0;
    pMVar34->c = 0;
    piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar34->data = m.data;
    pMVar34->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar34->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
    pMVar34->elempack = m.elempack;
    pMVar34->allocator = m.allocator;
    pMVar34->dims = m.dims;
    pMVar34->w = m.w;
    pMVar34->h = m.h;
    pMVar34->d = m.d;
    pMVar34->c = m.c;
    pMVar34->cstep = m.cstep;
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar43 = &_doffset;
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,piVar43,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
LAB_00274aa6:
  uVar44 = (undefined7)((ulong)piVar43 >> 8);
  if (iVar1 == 4) {
    if (3 < iVar39 - 1U) goto switchD_00274b6f_default;
    iVar41 = _outc >> 2;
    switch(iVar39) {
    case 1:
      uVar42 = _outw & 3;
      iVar35 = (uint)(uVar42 == 0) * 3 + 1;
      uVar45 = _outw / iVar35;
      if (local_15c == uVar45 && uVar42 == 0) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar43 = bottom_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 == (int *)0x0) goto LAB_00275f02;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_00275f02;
        __ptr = top_blob->data;
        pAVar2 = top_blob->allocator;
joined_r0x0027502f:
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
LAB_00275f02:
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar43 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar43;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar35 = bottom_blob->w;
        iVar39 = bottom_blob->h;
        iVar1 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar35;
        top_blob->h = iVar39;
        top_blob->d = iVar1;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
        return 0;
      }
      if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(top_blob,uVar45,(local_90 >> 2) << (uVar42 == 0) * '\x02',iVar35,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar35 = _woffset + 3;
          if (-1 < _woffset) {
            iVar35 = _woffset;
          }
          crop_pack4_sse(bottom_blob,top_blob,0,iVar35 >> 2);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      if (((_outw == local_15c) && ((_outh & 3U) == 0)) &&
         (_outh / (int)((uint)((_outh & 3U) == 0) * 3 + 1) == local_fc)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar43 = bottom_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 == (int *)0x0) goto LAB_00275f02;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_00275f02;
        __ptr = top_blob->data;
        pAVar2 = top_blob->allocator;
        goto joined_r0x0027502f;
      }
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(top_blob,_outw,_outh >> 2,(local_90 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar35 = _hoffset + 3;
          if (-1 < _hoffset) {
            iVar35 = _hoffset;
          }
          crop_pack4_sse(bottom_blob,top_blob,iVar35 >> 2,_woffset);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      uVar45 = _outc & 3;
      uVar37 = local_90 >> 2;
      uVar42 = local_fc ^ _outh | local_15c ^ _outw;
      bVar47 = uVar42 == 0;
      if (((bVar47) && ((_outc & 3U) == 0)) &&
         (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) == iVar35)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar43 = bottom_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 == (int *)0x0) goto LAB_00275f02;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_00275f02;
        __ptr = top_blob->data;
        pAVar2 = top_blob->allocator;
        goto joined_r0x0027502f;
      }
      if (((_coffset | _outc) & 3U) != 0) break;
      uVar40 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar40 +
                       (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar40;
      m.elemsize._4_4_ = (undefined4)(uVar40 >> 0x20);
      uVar13 = bottom_blob->dims;
      uVar14 = bottom_blob->w;
      uVar15 = bottom_blob->h;
      uVar16 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar40 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar40;
      m.dims = uVar13;
      m.w = uVar14;
      m.h = uVar15;
      m.d = uVar16;
      m.c = iVar41;
      if (bVar47) {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,
                   CONCAT31((int3)(uVar42 >> 8),bVar47),(void *)(ulong)(uint)_outh);
        if ((Mat *)&bottom_blob_shapes != top_blob) {
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + 1;
            UNLOCK();
          }
          piVar43 = top_blob->refcount;
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + -1;
            UNLOCK();
            if (*piVar43 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          top_blob->refcount =
               (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          top_blob->elemsize =
               (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          top_blob->elempack = iStack_e0;
          top_blob->allocator = pAStack_d8;
          top_blob->dims = iStack_d0;
          top_blob->w = iStack_cc;
          top_blob->h = iStack_c8;
          top_blob->d = iStack_c4;
          top_blob->c = local_c0;
          top_blob->cstep = local_b8;
        }
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (pAStack_d8 == (Allocator *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*pAStack_d8->_vptr_Allocator[3])();
            }
          }
        }
        iVar35 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_00276056;
      }
      else {
LAB_00276056:
        iVar35 = _outc + 3;
        if (-1 < _outc) {
          iVar35 = _outc;
        }
        Mat::create(top_blob,_outw,_outh,iVar35 >> 2,uVar37 << (uVar45 == 0) * '\x02',4,
                    opt->blob_allocator);
        iVar35 = -100;
        if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
          if (0 < top_blob->c) {
            lVar36 = 0;
            do {
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(m.cstep * lVar36 *
                             (long)bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage + (long)m.data);
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.data = (void *)(top_blob->cstep * lVar36 * m_2.elemsize + (long)top_blob->data);
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.refcount = (int *)0x0;
              m_2.c = top_blob->d;
              m_2.d = 1;
              m_2.dims = top_blob->dims + -1;
              m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                          m_2.elemsize;
              if (top_blob->dims == 4) {
                m_2.cstep = (long)m_2.h * (long)m_2.w;
              }
              crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
              lVar36 = lVar36 + 1;
            } while (lVar36 < top_blob->c);
          }
          iVar35 = 0;
        }
      }
      piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar43 == (int *)0x0) {
        return iVar35;
      }
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) {
        return iVar35;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar35;
      }
      goto joined_r0x002765c4;
    case 4:
      uVar45 = _outc & 3;
      uVar37 = local_90 >> 2;
      bVar47 = local_88 == _outd;
      bVar3 = local_fc == _outh;
      bVar4 = local_15c == _outw;
      if (((bVar47 && (bVar3 && bVar4)) && ((_outc & 3U) == 0)) &&
         (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) == iVar35)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar43 = bottom_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 == (int *)0x0) goto LAB_00275f02;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_00275f02;
        __ptr = top_blob->data;
        pAVar2 = top_blob->allocator;
        goto joined_r0x0027502f;
      }
      if (((_coffset | _outc) & 3U) != 0) break;
      uVar40 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar40 +
                       (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar40;
      m.elemsize._4_4_ = (undefined4)(uVar40 >> 0x20);
      uVar17 = bottom_blob->dims;
      uVar18 = bottom_blob->w;
      uVar19 = bottom_blob->h;
      uVar20 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar40 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar40;
      m.dims = uVar17;
      m.w = uVar18;
      m.h = uVar19;
      m.d = uVar20;
      m.c = iVar41;
      if (bVar47 && (bVar3 && bVar4)) {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,_outd,
                   (void *)CONCAT71(uVar44,bVar47 && (bVar3 && bVar4)));
        if ((Mat *)&bottom_blob_shapes != top_blob) {
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + 1;
            UNLOCK();
          }
          piVar43 = top_blob->refcount;
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + -1;
            UNLOCK();
            if (*piVar43 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          top_blob->refcount =
               (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          top_blob->elemsize =
               (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          top_blob->elempack = iStack_e0;
          top_blob->allocator = pAStack_d8;
          top_blob->dims = iStack_d0;
          top_blob->w = iStack_cc;
          top_blob->h = iStack_c8;
          top_blob->d = iStack_c4;
          top_blob->c = local_c0;
          top_blob->cstep = local_b8;
        }
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (pAStack_d8 == (Allocator *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*pAStack_d8->_vptr_Allocator[3])();
            }
          }
        }
        iVar35 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_002766ac;
      }
      else {
LAB_002766ac:
        iVar35 = _outc + 3;
        if (-1 < _outc) {
          iVar35 = _outc;
        }
        Mat::create(top_blob,_outw,_outh,_outd,iVar35 >> 2,uVar37 << (uVar45 == 0) * '\x02',4,
                    opt->blob_allocator);
        iVar35 = -100;
        if (top_blob->data != (void *)0x0) {
          uVar37 = (ulong)top_blob->c;
          if (top_blob->cstep * uVar37 != 0) {
            if (0 < top_blob->c) {
              uVar40 = (ulong)(uint)_outd;
              lVar36 = 0;
              do {
                if (0 < (int)uVar40) {
                  lVar46 = 0;
                  do {
                    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)m.data +
                                  (long)(_doffset + (int)lVar46) *
                                  (long)bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                                  (long)m.h * (long)m.w +
                                  m.cstep * lVar36 *
                                  (long)bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    m_2.w = top_blob->w;
                    m_2.h = top_blob->h;
                    m_2.elemsize = top_blob->elemsize;
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.cstep = (long)m_2.h * (long)m_2.w;
                    m_2.data = (void *)((long)top_blob->data +
                                       lVar46 * m_2.elemsize * m_2.cstep +
                                       top_blob->cstep * lVar36 * m_2.elemsize);
                    m_2.refcount = (int *)0x0;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                    uVar40 = (ulong)_outd;
                    lVar46 = lVar46 + 1;
                  } while (lVar46 < (long)uVar40);
                  uVar37 = (ulong)(uint)top_blob->c;
                }
                lVar36 = lVar36 + 1;
              } while (lVar36 < (int)uVar37);
            }
            iVar35 = 0;
          }
        }
      }
      piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar43 == (int *)0x0) {
        return iVar35;
      }
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) {
        return iVar35;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar35;
      }
      goto joined_r0x002768da;
    }
    goto switchD_00274b6f_default;
  }
  if (iVar1 == 8) {
    switch(iVar39) {
    case 1:
      uVar45 = _outw & 7;
      bVar47 = (_outw & 3U) == 0;
      iVar35 = 8;
      if (uVar45 != 0) {
        iVar35 = (uint)bVar47 * 3 + 1;
      }
      sVar38 = 3;
      if (uVar45 != 0) {
        sVar38 = bVar47 * '\x02';
      }
      if (local_15c == _outw / iVar35 && uVar45 == 0) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar43 = bottom_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 == (int *)0x0) goto LAB_00275f02;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_00275f02;
        __ptr = top_blob->data;
        pAVar2 = top_blob->allocator;
        goto joined_r0x0027502f;
      }
      if (((_outw | _woffset) & 7U) == 0) {
        Mat::create(top_blob,_outw / iVar35,(local_90 >> 3) << sVar38,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar35 = _woffset + 7;
          if (-1 < _woffset) {
            iVar35 = _woffset;
          }
          crop_pack8_avx(bottom_blob,top_blob,0,iVar35 >> 3);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      sVar38 = 3;
      if ((_outh & 7U) != 0) {
        sVar38 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == local_15c) {
        iVar35 = 8;
        if ((_outh & 7U) != 0) {
          iVar35 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) == 0) && (_outh / iVar35 == local_fc)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar43 = bottom_blob->refcount;
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + 1;
            UNLOCK();
          }
          piVar43 = top_blob->refcount;
          if (piVar43 == (int *)0x0) goto LAB_00275f02;
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 != 0) goto LAB_00275f02;
          __ptr = top_blob->data;
          pAVar2 = top_blob->allocator;
          goto joined_r0x0027502f;
        }
      }
      if (((_hoffset | _outh) & 7U) == 0) {
        iVar35 = _outh + 7;
        if (-1 < _outh) {
          iVar35 = _outh;
        }
        Mat::create(top_blob,_outw,iVar35 >> 3,(local_90 >> 3) << sVar38,8,opt->blob_allocator);
        if (top_blob->data != (void *)0x0) {
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar35 = _hoffset + 7;
            if (-1 < _hoffset) {
              iVar35 = _hoffset;
            }
            crop_pack8_avx(bottom_blob,top_blob,iVar35 >> 3,_woffset);
            return 0;
          }
          return -100;
        }
        return -100;
      }
      break;
    case 3:
      uVar37 = local_90 >> 3;
      sVar38 = 3;
      if ((_outc & 7U) != 0) {
        sVar38 = ((_outc & 3U) == 0) * '\x02';
      }
      if (local_fc == _outh && local_15c == _outw) {
        iVar39 = 8;
        if ((_outc & 7U) != 0) {
          iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar39 == iVar35)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar43 = bottom_blob->refcount;
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + 1;
            UNLOCK();
          }
          piVar43 = top_blob->refcount;
          if (piVar43 == (int *)0x0) goto LAB_00275f02;
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 != 0) goto LAB_00275f02;
          __ptr = top_blob->data;
          pAVar2 = top_blob->allocator;
          goto joined_r0x0027502f;
        }
      }
      if (((_coffset | _outc) & 7U) == 0) {
        iVar35 = _coffset + 7;
        if (-1 < _coffset) {
          iVar35 = _coffset;
        }
        iVar39 = _outc + 7;
        if (-1 < _outc) {
          iVar39 = _outc;
        }
        iVar39 = iVar39 >> 3;
        uVar40 = bottom_blob->elemsize;
        m.data = (void *)((long)(iVar35 >> 3) * bottom_blob->cstep * uVar40 +
                         (long)bottom_blob->data);
        m.elempack = bottom_blob->elempack;
        m.allocator = bottom_blob->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar40;
        m.elemsize._4_4_ = (undefined4)(uVar40 >> 0x20);
        uVar5 = bottom_blob->dims;
        uVar6 = bottom_blob->w;
        uVar7 = bottom_blob->h;
        uVar8 = bottom_blob->d;
        m.cstep = ((long)bottom_blob->d * uVar40 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf
                  & 0xfffffffffffffff0) / uVar40;
        m.dims = uVar5;
        m.w = uVar6;
        m.h = uVar7;
        m.d = uVar8;
        m.c = iVar39;
        if (local_fc != _outh || local_15c != _outw) {
LAB_00276cef:
          Mat::create(top_blob,_outw,_outh,iVar39,uVar37 << sVar38,8,opt->blob_allocator);
          iVar35 = -100;
          if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
            if (0 < top_blob->c) {
              lVar36 = 0;
              do {
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar36 *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage +
                              (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                m_2.w = top_blob->w;
                m_2.h = top_blob->h;
                m_2.elemsize = top_blob->elemsize;
                m_2.data = (void *)(top_blob->cstep * lVar36 * m_2.elemsize + (long)top_blob->data);
                m_2.elempack = top_blob->elempack;
                m_2.allocator = top_blob->allocator;
                m_2.refcount = (int *)0x0;
                m_2.c = top_blob->d;
                m_2.d = 1;
                m_2.dims = top_blob->dims + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (top_blob->dims == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                lVar36 = lVar36 + 1;
              } while (lVar36 < top_blob->c);
            }
            iVar35 = 0;
          }
        }
        else {
          Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,iVar39,
                     (void *)(ulong)(uint)_outh);
          if ((Mat *)&bottom_blob_shapes != top_blob) {
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar43 = top_blob->refcount;
            if (piVar43 != (int *)0x0) {
              LOCK();
              *piVar43 = *piVar43 + -1;
              UNLOCK();
              if (*piVar43 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            top_blob->refcount =
                 (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            top_blob->elemsize =
                 (size_t)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            top_blob->elempack = iStack_e0;
            top_blob->allocator = pAStack_d8;
            top_blob->dims = iStack_d0;
            top_blob->w = iStack_cc;
            top_blob->h = iStack_c8;
            top_blob->d = iStack_c4;
            top_blob->c = local_c0;
            top_blob->cstep = local_b8;
          }
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data == 0) {
              if (pAStack_d8 == (Allocator *)0x0) {
                if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (*pAStack_d8->_vptr_Allocator[3])();
              }
            }
          }
          iVar35 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar39 = _outc + 7;
            if (-1 < _outc) {
              iVar39 = _outc;
            }
            iVar39 = iVar39 >> 3;
            goto LAB_00276cef;
          }
        }
        piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar43 == (int *)0x0) {
          return iVar35;
        }
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) {
          return iVar35;
        }
        if (m.allocator != (Allocator *)0x0) {
          (*(m.allocator)->_vptr_Allocator[3])();
          return iVar35;
        }
        goto joined_r0x002765c4;
      }
      break;
    case 4:
      uVar37 = local_90 >> 3;
      sVar38 = 3;
      if ((_outc & 7U) != 0) {
        sVar38 = ((_outc & 3U) == 0) * '\x02';
      }
      if (local_88 == _outd && (local_fc == _outh && local_15c == _outw)) {
        iVar39 = 8;
        if ((_outc & 7U) != 0) {
          iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar39 == iVar35)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar43 = bottom_blob->refcount;
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + 1;
            UNLOCK();
          }
          piVar43 = top_blob->refcount;
          if (piVar43 == (int *)0x0) goto LAB_00275f02;
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 != 0) goto LAB_00275f02;
          __ptr = top_blob->data;
          pAVar2 = top_blob->allocator;
          goto joined_r0x0027502f;
        }
      }
      if (((_coffset | _outc) & 7U) == 0) {
        iVar35 = _coffset + 7;
        if (-1 < _coffset) {
          iVar35 = _coffset;
        }
        iVar39 = _outc + 7;
        if (-1 < _outc) {
          iVar39 = _outc;
        }
        uVar45 = iVar39 >> 3;
        uVar40 = bottom_blob->elemsize;
        m.data = (void *)((long)(iVar35 >> 3) * bottom_blob->cstep * uVar40 +
                         (long)bottom_blob->data);
        m.elempack = bottom_blob->elempack;
        m.allocator = bottom_blob->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar40;
        m.elemsize._4_4_ = (undefined4)(uVar40 >> 0x20);
        uVar9 = bottom_blob->dims;
        uVar10 = bottom_blob->w;
        uVar11 = bottom_blob->h;
        uVar12 = bottom_blob->d;
        m.cstep = ((long)bottom_blob->d * uVar40 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf
                  & 0xfffffffffffffff0) / uVar40;
        m.dims = uVar9;
        m.w = uVar10;
        m.h = uVar11;
        m.d = uVar12;
        m.c = uVar45;
        if (local_88 != _outd || (local_fc != _outh || local_15c != _outw)) {
LAB_00277017:
          Mat::create(top_blob,_outw,_outh,_outd,uVar45,uVar37 << sVar38,8,opt->blob_allocator);
          iVar35 = -100;
          if (top_blob->data != (void *)0x0) {
            uVar37 = (ulong)top_blob->c;
            if (top_blob->cstep * uVar37 != 0) {
              if (0 < top_blob->c) {
                uVar40 = (ulong)(uint)_outd;
                lVar36 = 0;
                do {
                  if (0 < (int)uVar40) {
                    lVar46 = 0;
                    do {
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar46) *
                                    (long)bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar36 *
                                    (long)bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      m_2.w = top_blob->w;
                      m_2.h = top_blob->h;
                      m_2.elemsize = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)m_2.w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar46 * m_2.elemsize * m_2.cstep +
                                         top_blob->cstep * lVar36 * m_2.elemsize);
                      m_2.refcount = (int *)0x0;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      uVar40 = (ulong)_outd;
                      lVar46 = lVar46 + 1;
                    } while (lVar46 < (long)uVar40);
                    uVar37 = (ulong)(uint)top_blob->c;
                  }
                  lVar36 = lVar36 + 1;
                } while (lVar36 < (int)uVar37);
              }
              iVar35 = 0;
            }
          }
        }
        else {
          Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,_outd,
                     (void *)(ulong)uVar45);
          if ((Mat *)&bottom_blob_shapes != top_blob) {
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar43 = top_blob->refcount;
            if (piVar43 != (int *)0x0) {
              LOCK();
              *piVar43 = *piVar43 + -1;
              UNLOCK();
              if (*piVar43 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            top_blob->refcount =
                 (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            top_blob->elemsize =
                 (size_t)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            top_blob->elempack = iStack_e0;
            top_blob->allocator = pAStack_d8;
            top_blob->dims = iStack_d0;
            top_blob->w = iStack_cc;
            top_blob->h = iStack_c8;
            top_blob->d = iStack_c4;
            top_blob->c = local_c0;
            top_blob->cstep = local_b8;
          }
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data == 0) {
              if (pAStack_d8 == (Allocator *)0x0) {
                if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (*pAStack_d8->_vptr_Allocator[3])();
              }
            }
          }
          iVar35 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar35 = _outc + 7;
            if (-1 < _outc) {
              iVar35 = _outc;
            }
            uVar45 = iVar35 >> 3;
            goto LAB_00277017;
          }
        }
        piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar43 == (int *)0x0) {
          return iVar35;
        }
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) {
          return iVar35;
        }
        if (m.allocator != (Allocator *)0x0) {
          (*(m.allocator)->_vptr_Allocator[3])();
          return iVar35;
        }
        goto joined_r0x002765c4;
      }
    }
    goto switchD_00274b6f_default;
  }
  if ((iVar1 != 0x10) || (3 < iVar39 - 1U)) goto switchD_00274b6f_default;
  switch(iVar39) {
  case 1:
    if ((_outw & 0xfU) == 0) {
      if (_outw >> 4 == local_15c) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar43 = bottom_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 == (int *)0x0) goto LAB_00275f02;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_00275f02;
        __ptr = top_blob->data;
        pAVar2 = top_blob->allocator;
        goto joined_r0x0027502f;
      }
      if ((_woffset & 0xfU) == 0) {
        Mat::create(top_blob,_outw >> 4,local_90 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar35 = _woffset + 0xf;
          if (-1 < _woffset) {
            iVar35 = _woffset;
          }
          crop_pack16_avx512(bottom_blob,top_blob,0,iVar35 >> 4);
          return 0;
        }
        return -100;
      }
    }
    break;
  case 2:
    if ((_outh & 0xfU) == 0) {
      uVar37 = 0x10;
    }
    else if ((_outh & 7U) == 0) {
      uVar37 = 8;
    }
    else {
      uVar37 = (ulong)((uint)((_outh & 3U) == 0) * 3 + 1);
    }
    iVar35 = (int)uVar37;
    if (((_outw == local_15c) && (iVar35 == 0x10)) && (_outh / iVar35 == local_fc)) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar43 = bottom_blob->refcount;
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + 1;
        UNLOCK();
      }
      piVar43 = top_blob->refcount;
      if (piVar43 == (int *)0x0) goto LAB_00275f02;
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) goto LAB_00275f02;
      __ptr = top_blob->data;
      pAVar2 = top_blob->allocator;
      goto joined_r0x0027502f;
    }
    if ((iVar35 == 0x10) && ((_hoffset & 0xfU) == 0)) {
      iVar35 = _outh + 0xf;
      if (-1 < _outh) {
        iVar35 = _outh;
      }
      Mat::create(top_blob,_outw,iVar35 >> 4,uVar37 * (local_90 >> 4),0x10,opt->blob_allocator);
      if (top_blob->data != (void *)0x0) {
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar35 = _hoffset + 0xf;
          if (-1 < _hoffset) {
            iVar35 = _hoffset;
          }
          crop_pack16_avx512(bottom_blob,top_blob,iVar35 >> 4,_woffset);
          return 0;
        }
        return -100;
      }
      return -100;
    }
    break;
  case 3:
    if ((_outc & 0xfU) == 0) {
      uVar45 = 0x10;
    }
    else if ((_outc & 7U) == 0) {
      uVar45 = 8;
    }
    else {
      uVar45 = (uint)((_outc & 3U) == 0) * 3 + 1;
    }
    bVar47 = local_fc == _outh;
    bVar3 = local_15c == _outw;
    if (((bVar47 && bVar3) && (uVar45 == 0x10)) && (_outc / (int)uVar45 == iVar35)) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar43 = bottom_blob->refcount;
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + 1;
        UNLOCK();
      }
      piVar43 = top_blob->refcount;
      if (piVar43 == (int *)0x0) goto LAB_00275f02;
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) goto LAB_00275f02;
      __ptr = top_blob->data;
      pAVar2 = top_blob->allocator;
      goto joined_r0x0027502f;
    }
    if (uVar45 != 0x10 || (_coffset & 0xfU) != 0) break;
    iVar35 = _outc + 0xf;
    if (-1 < _outc) {
      iVar35 = _outc;
    }
    iVar35 = iVar35 >> 4;
    uVar37 = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset >> 4) * bottom_blob->cstep * uVar37 + (long)bottom_blob->data)
    ;
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar37;
    m.elemsize._4_4_ = (undefined4)(uVar37 >> 0x20);
    uVar21 = bottom_blob->dims;
    uVar22 = bottom_blob->w;
    uVar23 = bottom_blob->h;
    uVar24 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar37 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar37;
    m.dims = uVar21;
    m.w = uVar22;
    m.h = uVar23;
    m.d = uVar24;
    m.c = iVar35;
    if (bVar47 && bVar3) {
      Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,iVar35,
                 (void *)CONCAT71(uVar44,bVar47 && bVar3));
      if ((Mat *)&bottom_blob_shapes != top_blob) {
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data =
             bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
        top_blob->refcount =
             (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        top_blob->elemsize =
             (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        top_blob->elempack = iStack_e0;
        top_blob->allocator = pAStack_d8;
        top_blob->dims = iStack_d0;
        top_blob->w = iStack_cc;
        top_blob->h = iStack_c8;
        top_blob->d = iStack_c4;
        top_blob->c = local_c0;
        top_blob->cstep = local_b8;
      }
      if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->data =
             *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->data + -1;
        UNLOCK();
        if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
          if (pAStack_d8 == (Allocator *)0x0) {
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            (*pAStack_d8->_vptr_Allocator[3])();
          }
        }
      }
      iVar35 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar35 = _outc + 0xf;
        if (-1 < _outc) {
          iVar35 = _outc;
        }
        iVar35 = iVar35 >> 4;
        goto LAB_00276382;
      }
    }
    else {
LAB_00276382:
      Mat::create(top_blob,_outw,_outh,iVar35,(ulong)uVar45 * (local_90 >> 4),0x10,
                  opt->blob_allocator);
      iVar35 = -100;
      if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
        if (0 < top_blob->c) {
          lVar36 = 0;
          do {
            bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
            bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(m.cstep * lVar36 *
                           (long)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + (long)m.data);
            bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar36 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            crop_pack16_avx512((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
            lVar36 = lVar36 + 1;
          } while (lVar36 < top_blob->c);
        }
        iVar35 = 0;
      }
    }
    piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar43 == (int *)0x0) {
      return iVar35;
    }
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 != 0) {
      return iVar35;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar35;
    }
    goto joined_r0x002765c4;
  case 4:
    if ((_outc & 0xfU) == 0) {
      uVar45 = 0x10;
    }
    else if ((_outc & 7U) == 0) {
      uVar45 = 8;
    }
    else {
      uVar45 = (uint)((_outc & 3U) == 0) * 3 + 1;
    }
    if (((local_88 == _outd && (local_fc == _outh && local_15c == _outw)) && (uVar45 == 0x10)) &&
       (_outc / (int)uVar45 == iVar35)) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar43 = bottom_blob->refcount;
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + 1;
        UNLOCK();
      }
      piVar43 = top_blob->refcount;
      if (piVar43 == (int *)0x0) goto LAB_00275f02;
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) goto LAB_00275f02;
      __ptr = top_blob->data;
      pAVar2 = top_blob->allocator;
      goto joined_r0x0027502f;
    }
    if (uVar45 != 0x10 || (_coffset & 0xfU) != 0) break;
    iVar35 = _outc + 0xf;
    if (-1 < _outc) {
      iVar35 = _outc;
    }
    uVar42 = iVar35 >> 4;
    uVar37 = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset >> 4) * bottom_blob->cstep * uVar37 + (long)bottom_blob->data)
    ;
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar37;
    m.elemsize._4_4_ = (undefined4)(uVar37 >> 0x20);
    uVar25 = bottom_blob->dims;
    uVar26 = bottom_blob->w;
    uVar27 = bottom_blob->h;
    uVar28 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar37 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar37;
    m.dims = uVar25;
    m.w = uVar26;
    m.h = uVar27;
    m.d = uVar28;
    m.c = uVar42;
    if (local_88 != _outd || (local_fc != _outh || local_15c != _outw)) {
LAB_002769d0:
      Mat::create(top_blob,_outw,_outh,_outd,uVar42,(ulong)uVar45 * (local_90 >> 4),0x10,
                  opt->blob_allocator);
      iVar35 = -100;
      if (top_blob->data != (void *)0x0) {
        uVar37 = (ulong)top_blob->c;
        if (top_blob->cstep * uVar37 != 0) {
          if (0 < top_blob->c) {
            uVar40 = (ulong)(uint)_outd;
            lVar36 = 0;
            do {
              if (0 < (int)uVar40) {
                lVar46 = 0;
                do {
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar46) *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                                (long)m.h * (long)m.w +
                                m.cstep * lVar36 *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  m_2.w = top_blob->w;
                  m_2.h = top_blob->h;
                  m_2.elemsize = top_blob->elemsize;
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                  m_2.data = (void *)((long)top_blob->data +
                                     lVar46 * m_2.elemsize * m_2.cstep +
                                     top_blob->cstep * lVar36 * m_2.elemsize);
                  m_2.refcount = (int *)0x0;
                  m_2.dims = 2;
                  m_2.d = 1;
                  m_2.c = 1;
                  crop_pack16_avx512((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  uVar40 = (ulong)_outd;
                  lVar46 = lVar46 + 1;
                } while (lVar46 < (long)uVar40);
                uVar37 = (ulong)(uint)top_blob->c;
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 < (int)uVar37);
          }
          iVar35 = 0;
        }
      }
    }
    else {
      Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,_outd,
                 (void *)(ulong)uVar42);
      if ((Mat *)&bottom_blob_shapes != top_blob) {
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + 1;
          UNLOCK();
        }
        piVar43 = top_blob->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data =
             bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
        top_blob->refcount =
             (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        top_blob->elemsize =
             (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        top_blob->elempack = iStack_e0;
        top_blob->allocator = pAStack_d8;
        top_blob->dims = iStack_d0;
        top_blob->w = iStack_cc;
        top_blob->h = iStack_c8;
        top_blob->d = iStack_c4;
        top_blob->c = local_c0;
        top_blob->cstep = local_b8;
      }
      if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->data =
             *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->data + -1;
        UNLOCK();
        if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
          if (pAStack_d8 == (Allocator *)0x0) {
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            (*pAStack_d8->_vptr_Allocator[3])();
          }
        }
      }
      iVar35 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar35 = _outc + 0xf;
        if (-1 < _outc) {
          iVar35 = _outc;
        }
        uVar42 = iVar35 >> 4;
        goto LAB_002769d0;
      }
    }
    piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar43 == (int *)0x0) {
      return iVar35;
    }
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 != 0) {
      return iVar35;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar35;
    }
joined_r0x002765c4:
    if (m.data == (void *)0x0) {
      return iVar35;
    }
    goto LAB_00275e69;
  }
switchD_00274b6f_default:
  piVar43 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar29 = bottom_blob->dims;
  uVar30 = bottom_blob->w;
  uVar31 = bottom_blob->h;
  uVar32 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + 1;
    UNLOCK();
  }
  m.dims = uVar29;
  m.w = uVar30;
  m.h = uVar31;
  m.d = uVar32;
  if (iVar1 == 1) {
LAB_00275e11:
    iVar35 = Crop::forward(&this->super_Crop,&m,top_blob,opt);
  }
  else {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) goto LAB_00275e11;
    iVar35 = -100;
  }
  piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 == 0) {
      if (m.allocator == (Allocator *)0x0) {
joined_r0x002768da:
        if (m.data != (void *)0x0) {
LAB_00275e69:
          m.allocator = (Allocator *)0x0;
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar35;
}

Assistant:

int Crop_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}